

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O1

void __thiscall ftxui::ComponentBase::Detach(ComponentBase *this)

{
  ComponentBase *pCVar1;
  shared_ptr<ftxui::ComponentBase> *psVar2;
  shared_ptr<ftxui::ComponentBase> *psVar3;
  long lVar4;
  shared_ptr<ftxui::ComponentBase> *psVar5;
  iterator __position;
  
  pCVar1 = this->parent_;
  if (pCVar1 == (ComponentBase *)0x0) {
    return;
  }
  psVar2 = (pCVar1->children_).
           super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (pCVar1->children_).
           super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)psVar3 - (long)psVar2 >> 6;
  psVar5 = psVar2;
  if (0 < lVar4) {
    psVar5 = (shared_ptr<ftxui::ComponentBase> *)
             ((long)&(psVar2->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr + ((long)psVar3 - (long)psVar2 & 0xffffffffffffffc0U));
    lVar4 = lVar4 + 1;
    __position._M_current = psVar2 + 2;
    do {
      if (__position._M_current[-2].
          super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr == this) {
        __position._M_current = __position._M_current + -2;
        goto LAB_0013b71a;
      }
      if (__position._M_current[-1].
          super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr == this) {
        __position._M_current = __position._M_current + -1;
        goto LAB_0013b71a;
      }
      if (((__position._M_current)->
          super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == this)
      goto LAB_0013b71a;
      if (__position._M_current[1].
          super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr == this) {
        __position._M_current = __position._M_current + 1;
        goto LAB_0013b71a;
      }
      lVar4 = lVar4 + -1;
      __position._M_current = __position._M_current + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)psVar3 - (long)psVar5 >> 4;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      __position._M_current = psVar3;
      if ((lVar4 != 3) ||
         (__position._M_current = psVar5,
         (psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
         this)) goto LAB_0013b71a;
      psVar5 = psVar5 + 1;
    }
    __position._M_current = psVar5;
    if ((psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        this) goto LAB_0013b71a;
    psVar5 = psVar5 + 1;
  }
  __position._M_current = psVar5;
  if ((psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr != this)
  {
    __position._M_current = psVar3;
  }
LAB_0013b71a:
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::_M_erase(&pCVar1->children_,__position);
  this->parent_ = (ComponentBase *)0x0;
  return;
}

Assistant:

void ComponentBase::Detach() {
  if (!parent_)
    return;
  auto it = std::find_if(std::begin(parent_->children_),  //
                         std::end(parent_->children_),    //
                         [this](const Component& that) {  //
                           return this == that.get();
                         });
  parent_->children_.erase(it);
  parent_ = nullptr;
}